

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTFWrapper.cpp
# Opt level: O2

bool llvm::ConvertCodePointToUTF8(uint Source,char **ResultPtr)

{
  ConversionResult CVar1;
  UTF8 *TargetStart;
  UTF32 *SourceStart;
  uint local_1c;
  UTF8 *local_18;
  uint *local_10;
  
  local_10 = &local_1c;
  local_18 = (UTF8 *)*ResultPtr;
  local_1c = Source;
  CVar1 = ConvertUTF32toUTF8(&local_10,(UTF32 *)&local_18,&local_18,local_18 + 4,strictConversion);
  if (CVar1 == conversionOK) {
    *ResultPtr = (char *)local_18;
  }
  return CVar1 == conversionOK;
}

Assistant:

bool ConvertCodePointToUTF8(unsigned Source, char *&ResultPtr) {
  const UTF32 *SourceStart = &Source;
  const UTF32 *SourceEnd = SourceStart + 1;
  UTF8 *TargetStart = reinterpret_cast<UTF8 *>(ResultPtr);
  UTF8 *TargetEnd = TargetStart + 4;
  ConversionResult CR = ConvertUTF32toUTF8(&SourceStart, SourceEnd,
                                           &TargetStart, TargetEnd,
                                           strictConversion);
  if (CR != conversionOK)
    return false;

  ResultPtr = reinterpret_cast<char*>(TargetStart);
  return true;
}